

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * __thiscall
CLI::detail::rjoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (string *__return_storage_ptr__,detail *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *v,string *delim)

{
  long lVar1;
  size_t start;
  ulong uVar2;
  long lVar3;
  long lVar4;
  ostringstream s;
  
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
  lVar4 = -0x20;
  uVar2 = 0;
  while( true ) {
    lVar3 = *(long *)this;
    lVar1 = *(long *)(this + 8) - lVar3;
    if ((ulong)(lVar1 >> 5) <= uVar2) break;
    if (uVar2 != 0) {
      ::std::operator<<((ostream *)&s,(string *)v);
      lVar3 = *(long *)this;
      lVar1 = *(long *)(this + 8) - lVar3;
    }
    ::std::operator<<((ostream *)&s,(string *)(lVar3 + lVar4 + lVar1));
    uVar2 = uVar2 + 1;
    lVar4 = lVar4 + -0x20;
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
  return __return_storage_ptr__;
}

Assistant:

std::string rjoin(const T &v, std::string delim = ",") {
    std::ostringstream s;
    for(size_t start = 0; start < v.size(); start++) {
        if(start > 0)
            s << delim;
        s << v[v.size() - start - 1];
    }
    return s.str();
}